

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  jpeg_color_quantizer *pjVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  boxptr boxp_00;
  ulong uVar9;
  long lVar10;
  boxptr pbVar11;
  long lVar12;
  boxptr boxp;
  long lVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  boxptr which;
  boxptr boxp_01;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  char cVar24;
  int *piVar25;
  ulong uVar26;
  int iVar27;
  bool bVar28;
  
  pjVar6 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar6[1].start_pass;
  uVar1 = *(uint *)&pjVar6[1].color_quantize;
  uVar26 = (ulong)(int)uVar1;
  uVar16 = 1;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,uVar26 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box((j_decompress_ptr)cinfo->cquantize[1].finish_pass,boxp_00);
  if (1 < (long)uVar26) {
    uVar17 = 1;
    do {
      if (uVar17 * 2 < uVar26 || uVar17 * 2 - uVar26 == 0) {
        boxp_01 = (boxptr)0x0;
        lVar19 = 0;
        uVar9 = uVar17;
        pbVar11 = boxp_00;
        do {
          if ((lVar19 < pbVar11->colorcount) && (0 < pbVar11->volume)) {
            lVar19 = pbVar11->colorcount;
            boxp_01 = pbVar11;
          }
          pbVar11 = pbVar11 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      else {
        boxp_01 = (boxptr)0x0;
        lVar19 = 0;
        uVar9 = uVar17;
        pbVar11 = boxp_00;
        do {
          if (lVar19 < pbVar11->volume) {
            boxp_01 = pbVar11;
            lVar19 = pbVar11->volume;
          }
          pbVar11 = pbVar11 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      if (boxp_01 == (boxptr)0x0) {
        uVar16 = (uint)uVar17;
        break;
      }
      iVar2 = boxp_01->c0max;
      boxp_00[uVar17].c0max = iVar2;
      iVar3 = boxp_01->c1max;
      boxp_00[uVar17].c1max = iVar3;
      iVar27 = boxp_01->c2max;
      boxp_00[uVar17].c2max = iVar27;
      iVar4 = boxp_01->c0min;
      boxp_00[uVar17].c0min = iVar4;
      iVar20 = boxp_01->c1min;
      boxp_00[uVar17].c1min = iVar20;
      iVar5 = boxp_01->c2min;
      iVar14 = (iVar2 - iVar4) * 0x10;
      iVar8 = (iVar3 - iVar20) * 0xc;
      bVar28 = iVar14 + (iVar3 - iVar20) * -0xc < 0;
      iVar15 = iVar14;
      if (iVar14 == iVar8 || SBORROW4(iVar14,iVar8) != bVar28) {
        iVar15 = iVar8;
      }
      cVar24 = iVar14 == iVar8 || SBORROW4(iVar14,iVar8) != bVar28;
      boxp_00[uVar17].c2min = iVar5;
      if (iVar15 < (iVar27 - iVar5) * 8) {
        cVar24 = '\x02';
      }
      if (cVar24 == '\x02') {
        piVar25 = &boxp_01->c2max;
        pbVar11 = (boxptr)&boxp_00[uVar17].c2min;
        iVar20 = iVar5 + iVar27;
      }
      else if (cVar24 == '\x01') {
        piVar25 = &boxp_01->c1max;
        iVar20 = iVar20 + iVar3;
        pbVar11 = (boxptr)&boxp_00[uVar17].c1min;
      }
      else {
        piVar25 = &boxp_01->c0max;
        iVar20 = iVar4 + iVar2;
        pbVar11 = boxp_00 + uVar17;
      }
      *piVar25 = iVar20 / 2;
      pbVar11->c0min = iVar20 / 2 + 1;
      update_box((j_decompress_ptr)cinfo->cquantize[1].finish_pass,boxp_01);
      update_box((j_decompress_ptr)cinfo->cquantize[1].finish_pass,boxp_00 + uVar17);
      uVar17 = uVar17 + 1;
      uVar16 = uVar1;
    } while (uVar17 != uVar26);
    if ((int)uVar16 < 1) goto LAB_0010b6c9;
  }
  uVar26 = 0;
  do {
    lVar19 = (long)boxp_00[uVar26].c0min;
    if (boxp_00[uVar26].c0max < boxp_00[uVar26].c0min) {
      lVar22 = 0;
      lVar10 = 0;
      lVar12 = 0;
      lVar23 = 0;
    }
    else {
      iVar2 = boxp_00[uVar26].c2min;
      iVar3 = boxp_00[uVar26].c1min;
      lVar23 = 0;
      lVar12 = 0;
      lVar10 = 0;
      lVar22 = 0;
      do {
        if (iVar3 <= boxp_00[uVar26].c1max) {
          lVar21 = *(long *)(cinfo->cquantize[1].finish_pass + lVar19 * 8) +
                   (long)iVar3 * 0x40 + (long)iVar2 * 2;
          lVar18 = (long)iVar3;
          do {
            if (iVar2 <= boxp_00[uVar26].c2max) {
              lVar13 = 0;
              iVar27 = iVar2 * 8 + 4;
              do {
                uVar17 = (ulong)*(ushort *)(lVar21 + lVar13 * 2);
                if (uVar17 != 0) {
                  lVar22 = lVar22 + uVar17;
                  lVar10 = lVar10 + uVar17 * (long)((int)lVar19 * 8 + 4);
                  lVar12 = lVar12 + uVar17 * (long)((int)lVar18 * 4 + 2);
                  lVar23 = lVar23 + (long)iVar27 * uVar17;
                }
                lVar13 = lVar13 + 1;
                iVar27 = iVar27 + 8;
              } while ((boxp_00[uVar26].c2max - iVar2) + 1 != (int)lVar13);
            }
            lVar18 = lVar18 + 1;
            lVar21 = lVar21 + 0x40;
          } while (boxp_00[uVar26].c1max + 1 != (int)lVar18);
        }
        lVar19 = lVar19 + 1;
      } while (boxp_00[uVar26].c0max + 1 != (int)lVar19);
    }
    lVar19 = lVar22 >> 1;
    (*cinfo->colormap)[uVar26] = (JSAMPLE)((lVar10 + lVar19) / lVar22);
    cinfo->colormap[1][uVar26] = (JSAMPLE)((lVar12 + lVar19) / lVar22);
    cinfo->colormap[2][uVar26] = (JSAMPLE)((lVar19 + lVar23) / lVar22);
    uVar26 = uVar26 + 1;
  } while (uVar26 != uVar16);
LAB_0010b6c9:
  cinfo->actual_number_of_colors = uVar16;
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 0x62;
  (pjVar7->msg_parm).i[0] = uVar16;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar6[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1 (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}